

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

bool ImGui::SFML::Init(Window *window,Vector2f *displaySize,bool loadDefaultFont)

{
  float fVar1;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
  *this;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
  *__last;
  bool bVar2;
  uint uVar3;
  pointer puVar4;
  tuple<(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  tVar5;
  ulong uVar6;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
  *__result;
  pointer puVar7;
  pointer *ppuVar8;
  ImGuiIO *pIVar9;
  _Tp_alloc_type *__alloc;
  size_t __n;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer this_00;
  
  puVar4 = (pointer)operator_new(0x120);
  sf::Texture::Texture((Texture *)(puVar4 + 2));
  puVar4[9]._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = (_Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
          )0x0;
  *(undefined8 *)
   ((long)&puVar4[0x14]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
   + 4) = 0x100000000;
  *(undefined2 *)
   ((long)&puVar4[0x15]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
   + 4) = 0;
  puVar4[0x16]._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = (_Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
          )0x3f000000;
  *(undefined4 *)
   &puVar4[0x17]._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = 1;
  *(undefined2 *)
   ((long)&puVar4[0x17]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
   + 4) = 0;
  *(undefined4 *)
   &puVar4[0x18]._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = 0x3f000000;
  this_00 = puVar4 + 0x19;
  lVar10 = 0;
  do {
    sf::Cursor::Cursor((Cursor *)this_00);
    lVar10 = lVar10 + -8;
    this_00 = this_00 + 1;
  } while (lVar10 != -0x48);
  (puVar4->_M_t).
  super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = (_Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
          )window;
  tVar5.
  super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
        )CreateContext((ImFontAtlas *)0x0);
  puVar4[1]._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = tVar5.
         super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
         .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl;
  bVar2 = sf::Window::hasFocus
                    ((Window *)
                     (puVar4->_M_t).
                     super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                    );
  *(bool *)&puVar4[7]._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = bVar2;
  *(undefined1 *)
   ((long)&puVar4[7]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
   + 1) = 0;
  for (lVar10 = 0x3a; lVar10 != 0x3d; lVar10 = lVar10 + 1) {
    *(undefined1 *)
     ((long)&(puVar4->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
     + lVar10) = 0;
    *(undefined1 *)
     ((long)&puVar4[1]._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
     + lVar10 + 2) = 0;
  }
  *(undefined4 *)
   &puVar4[8]._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = 9;
  uVar3 = anon_unknown.dwarf_115aec::getConnectedJoystickId();
  *(uint *)&puVar4[10]._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       = uVar3;
  for (lVar10 = 0x15; lVar10 != 0x29; lVar10 = lVar10 + 1) {
    *(undefined4 *)
     ((long)&(puVar4->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
     + lVar10 * 4) = 0x20;
  }
  for (lVar10 = 0x110;
      __last = (_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                *)DAT_0021b150, this = (anonymous_namespace)::s_windowContexts, lVar10 != 0x119;
      lVar10 = lVar10 + 1) {
    *(undefined1 *)
     ((long)&(puVar4->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
     + lVar10) = 0;
  }
  if (DAT_0021b150 == DAT_0021b158) {
    if ((long)DAT_0021b150 - (long)(anonymous_namespace)::s_windowContexts == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (long)DAT_0021b150 - (long)(anonymous_namespace)::s_windowContexts >> 3;
    uVar6 = 1;
    if ((_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
         *)DAT_0021b150 != (anonymous_namespace)::s_windowContexts) {
      uVar6 = uVar11;
    }
    uVar12 = uVar6 + uVar11;
    __alloc = (_Tp_alloc_type *)0xfffffffffffffff;
    if (0xffffffffffffffe < uVar12) {
      uVar12 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar6,uVar11)) {
      uVar12 = 0xfffffffffffffff;
    }
    if (uVar12 == 0) {
      __result = (_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                  *)0x0;
    }
    else {
      __result = (_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                  *)operator_new(uVar12 * 8);
    }
    (&(__result->_M_impl).super__Vector_impl_data._M_start)[uVar11] = puVar4;
    puVar7 = std::
             vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
             ::_S_relocate((pointer)this,(pointer)__last,(pointer)__result,__alloc);
    ppuVar8 = (pointer *)
              std::
              vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
              ::_S_relocate((pointer)__last,(pointer)__last,puVar7 + 1,__alloc);
    std::
    _Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
    ::_M_deallocate(this,(pointer)((long)DAT_0021b158 - (long)this >> 3),__n);
    DAT_0021b158 = &(__result->_M_impl).super__Vector_impl_data._M_start + uVar12;
    (anonymous_namespace)::s_windowContexts = __result;
  }
  else {
    (((_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
       *)DAT_0021b150)->_M_impl).super__Vector_impl_data._M_start = puVar4;
    ppuVar8 = &(((_Vector_base<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                  *)DAT_0021b150)->_M_impl).super__Vector_impl_data._M_finish;
  }
  (anonymous_namespace)::s_currWindowCtx = ((_Vector_impl_data *)(ppuVar8 + -1))->_M_start;
  DAT_0021b150 = ppuVar8;
  SetCurrentContext((ImGuiContext *)
                    (anonymous_namespace)::s_currWindowCtx[1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>.
                    _M_head_impl);
  pIVar9 = GetIO();
  *(byte *)&pIVar9->BackendFlags = (byte)pIVar9->BackendFlags | 7;
  pIVar9->BackendPlatformName = "imgui_impl_sfml";
  pIVar9->KeyMap[0x200] = 0x3c;
  pIVar9->KeyMap[0x201] = 0x47;
  pIVar9->KeyMap[0x202] = 0x48;
  pIVar9->KeyMap[0x203] = 0x49;
  pIVar9->KeyMap[0x204] = 0x4a;
  pIVar9->KeyMap[0x205] = 0x3d;
  pIVar9->KeyMap[0x206] = 0x3e;
  pIVar9->KeyMap[0x207] = 0x40;
  pIVar9->KeyMap[0x208] = 0x3f;
  pIVar9->KeyMap[0x209] = 0x41;
  pIVar9->KeyMap[0x20a] = 0x42;
  pIVar9->KeyMap[0x20b] = 0x3b;
  pIVar9->KeyMap[0x20c] = 0x39;
  pIVar9->KeyMap[0x20d] = 0x3a;
  pIVar9->KeyMap[0x20e] = 0x24;
  pIVar9->KeyMap[0x222] = 0;
  pIVar9->KeyMap[0x224] = 2;
  pIVar9->KeyMap[0x237] = 0x15;
  pIVar9->KeyMap[0x239] = 0x17;
  pIVar9->KeyMap[0x23a] = 0x18;
  pIVar9->KeyMap[0x23b] = 0x19;
  uVar3 = anon_unknown.dwarf_115aec::getConnectedJoystickId();
  *(uint *)&(anonymous_namespace)::s_currWindowCtx[10]._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
            .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl =
       uVar3;
  SetJoystickMapping(0,0);
  SetJoystickMapping(1,1);
  SetJoystickMapping(2,3);
  SetJoystickMapping(3,2);
  SetJoystickMapping(0xc,4);
  SetJoystickMapping(0xd,5);
  SetJoystickMapping(0xe,4);
  SetJoystickMapping(0xf,5);
  SetDPadXAxis(PovX,false);
  SetDPadYAxis(PovY,false);
  SetLStickXAxis(X,false);
  SetLStickYAxis(Y,false);
  SetJoystickDPadThreshold(5.0);
  SetJoystickLStickThreshold(5.0);
  fVar1 = displaySize->y;
  (pIVar9->DisplaySize).x = displaySize->x;
  (pIVar9->DisplaySize).y = fVar1;
  pIVar9->SetClipboardTextFn = anon_unknown.dwarf_115aec::setClipboardText;
  pIVar9->GetClipboardTextFn = anon_unknown.dwarf_115aec::getClipboardText;
  anon_unknown.dwarf_115aec::loadMouseCursor(0,Arrow);
  anon_unknown.dwarf_115aec::loadMouseCursor(1,Text);
  anon_unknown.dwarf_115aec::loadMouseCursor(2,SizeAll);
  anon_unknown.dwarf_115aec::loadMouseCursor(3,SizeVertical);
  anon_unknown.dwarf_115aec::loadMouseCursor(4,SizeHorizontal);
  anon_unknown.dwarf_115aec::loadMouseCursor(5,SizeBottomLeftTopRight);
  anon_unknown.dwarf_115aec::loadMouseCursor(6,SizeTopLeftBottomRight);
  anon_unknown.dwarf_115aec::loadMouseCursor(7,Hand);
  if (loadDefaultFont) {
    bVar2 = UpdateFontTexture();
    return bVar2;
  }
  return true;
}

Assistant:

bool Init(sf::Window& window, const sf::Vector2f& displaySize, bool loadDefaultFont) {
#if __cplusplus < 201103L // runtime assert when using earlier than C++11 as no
                          // static_assert support
    assert(sizeof(GLuint) <= sizeof(ImTextureID)); // ImTextureID is not large enough to fit
                                                   // GLuint.
#endif

    s_windowContexts.emplace_back(new WindowContext(&window));

    s_currWindowCtx = s_windowContexts.back().get();
    ImGui::SetCurrentContext(s_currWindowCtx->imContext);

    ImGuiIO& io = ImGui::GetIO();

    // tell ImGui which features we support
    io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;
    io.BackendPlatformName = "imgui_impl_sfml";

    // init keyboard mapping
    io.KeyMap[ImGuiKey_Tab] = sf::Keyboard::Tab;
    io.KeyMap[ImGuiKey_LeftArrow] = sf::Keyboard::Left;
    io.KeyMap[ImGuiKey_RightArrow] = sf::Keyboard::Right;
    io.KeyMap[ImGuiKey_UpArrow] = sf::Keyboard::Up;
    io.KeyMap[ImGuiKey_DownArrow] = sf::Keyboard::Down;
    io.KeyMap[ImGuiKey_PageUp] = sf::Keyboard::PageUp;
    io.KeyMap[ImGuiKey_PageDown] = sf::Keyboard::PageDown;
    io.KeyMap[ImGuiKey_Home] = sf::Keyboard::Home;
    io.KeyMap[ImGuiKey_End] = sf::Keyboard::End;
    io.KeyMap[ImGuiKey_Insert] = sf::Keyboard::Insert;
    io.KeyMap[ImGuiKey_Delete] = sf::Keyboard::Delete;
    io.KeyMap[ImGuiKey_Backspace] = sf::Keyboard::Backspace;
    io.KeyMap[ImGuiKey_Space] = sf::Keyboard::Space;
    io.KeyMap[ImGuiKey_Enter] = sf::Keyboard::Enter;
    io.KeyMap[ImGuiKey_Escape] = sf::Keyboard::Escape;
    io.KeyMap[ImGuiKey_A] = sf::Keyboard::A;
    io.KeyMap[ImGuiKey_C] = sf::Keyboard::C;
    io.KeyMap[ImGuiKey_V] = sf::Keyboard::V;
    io.KeyMap[ImGuiKey_X] = sf::Keyboard::X;
    io.KeyMap[ImGuiKey_Y] = sf::Keyboard::Y;
    io.KeyMap[ImGuiKey_Z] = sf::Keyboard::Z;

    s_currWindowCtx->joystickId = getConnectedJoystickId();

    initDefaultJoystickMapping();

    // init rendering
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);

    // clipboard
    io.SetClipboardTextFn = setClipboardText;
    io.GetClipboardTextFn = getClipboardText;

    // load mouse cursors
    loadMouseCursor(ImGuiMouseCursor_Arrow, sf::Cursor::Arrow);
    loadMouseCursor(ImGuiMouseCursor_TextInput, sf::Cursor::Text);
    loadMouseCursor(ImGuiMouseCursor_ResizeAll, sf::Cursor::SizeAll);
    loadMouseCursor(ImGuiMouseCursor_ResizeNS, sf::Cursor::SizeVertical);
    loadMouseCursor(ImGuiMouseCursor_ResizeEW, sf::Cursor::SizeHorizontal);
    loadMouseCursor(ImGuiMouseCursor_ResizeNESW, sf::Cursor::SizeBottomLeftTopRight);
    loadMouseCursor(ImGuiMouseCursor_ResizeNWSE, sf::Cursor::SizeTopLeftBottomRight);
    loadMouseCursor(ImGuiMouseCursor_Hand, sf::Cursor::Hand);

    if (loadDefaultFont) {
        // this will load default font automatically
        // No need to call AddDefaultFont
        return UpdateFontTexture();
    }

    return true;
}